

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_handle.cpp
# Opt level: O1

torrent_handle __thiscall
libtorrent::session_handle::
sync_call_ret<libtorrent::torrent_handle,libtorrent::torrent_handle(libtorrent::aux::session_impl::*)(libtorrent::digest32<160l>const&),libtorrent::digest32<160l>const&>
          (session_handle *this,offset_in_session_impl_to_subr f,digest32<160L> *a)

{
  int iVar1;
  session_impl *ses;
  int iVar2;
  undefined8 uVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __weak_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  uint *in_R8;
  bool bVar5;
  torrent_handle tVar6;
  bool done;
  exception_ptr ex;
  bool local_89;
  exception_ptr local_88;
  void *local_80;
  type_conflict local_78;
  io_context *local_28;
  undefined4 local_1c;
  
  this_00 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(f + 8);
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    iVar2 = this_00->_M_use_count;
    do {
      if (iVar2 == 0) {
        this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        break;
      }
      LOCK();
      iVar1 = this_00->_M_use_count;
      bVar5 = iVar2 == iVar1;
      if (bVar5) {
        this_00->_M_use_count = iVar2 + 1;
        iVar1 = iVar2;
      }
      iVar2 = iVar1;
      UNLOCK();
    } while (!bVar5);
  }
  if (this_00 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    bVar5 = true;
  }
  else {
    bVar5 = this_00->_M_use_count == 0;
  }
  if ((bVar5) || (ses = *(session_impl **)f, ses == (session_impl *)0x0)) {
    local_78.r = (torrent_handle *)CONCAT44(local_78.r._4_4_,0x73);
    aux::throw_ex<boost::system::system_error,libtorrent::errors::error_code_enum>
              ((error_code_enum *)&local_78);
  }
  local_78.done = &local_89;
  local_89 = false;
  (this->m_impl).super___weak_ptr<libtorrent::aux::session_impl,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)0x0;
  (this->m_impl).super___weak_ptr<libtorrent::aux::session_impl,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_78.ex = &local_88;
  local_88._M_exception_object = (void *)0x0;
  local_28 = ses->m_io_context;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
  }
  local_78.a.m_number._M_elems._0_8_ = *(undefined8 *)in_R8;
  local_78.a.m_number._M_elems._8_8_ = *(undefined8 *)(in_R8 + 2);
  local_78.a.m_number._M_elems[4] = in_R8[4];
  local_1c = 0;
  local_78.r = (torrent_handle *)this;
  local_78.s.super___shared_ptr<libtorrent::aux::session_impl,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       ses;
  local_78.s.super___shared_ptr<libtorrent::aux::session_impl,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = this_00;
  local_78.f = (offset_in_session_impl_to_subr)a;
  boost::asio::io_context::basic_executor_type<std::allocator<void>,0u>::
  execute<libtorrent::session_handle::sync_call_ret<libtorrent::torrent_handle,libtorrent::torrent_handle(libtorrent::aux::session_impl::*)(libtorrent::digest32<160l>const&),libtorrent::digest32<160l>const&>(libtorrent::torrent_handle(libtorrent::aux::session_impl::*)(libtorrent::digest32<160l>const&),libtorrent::digest32<160l>const&)const::_lambda()_1_>
            ((basic_executor_type<std::allocator<void>,0u> *)&local_28,&local_78);
  if (local_78.s.super___shared_ptr<libtorrent::aux::session_impl,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.s.
               super___shared_ptr<libtorrent::aux::session_impl,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  aux::torrent_wait(&local_89,ses);
  if (local_88._M_exception_object != (void *)0x0) {
    local_80 = local_88._M_exception_object;
    ::std::__exception_ptr::exception_ptr::_M_addref();
    uVar3 = ::std::rethrow_exception((exception_ptr)&local_80);
    if (local_80 != (void *)0x0) {
      ::std::__exception_ptr::exception_ptr::_M_release();
    }
    if (local_88._M_exception_object != (void *)0x0) {
      ::std::__exception_ptr::exception_ptr::_M_release();
    }
    torrent_handle::~torrent_handle((torrent_handle *)this);
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    }
    _Unwind_Resume(uVar3);
  }
  _Var4._M_pi = extraout_RDX;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    _Var4._M_pi = extraout_RDX_00;
  }
  tVar6.m_torrent.super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = _Var4._M_pi;
  tVar6.m_torrent.super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (torrent_handle)
         tVar6.m_torrent.super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Ret session_handle::sync_call_ret(Fun f, Args&&... a) const
	{
		std::shared_ptr<session_impl> s = m_impl.lock();
		if (!s) aux::throw_ex<system_error>(errors::invalid_session_handle);

		// this is the flag to indicate the call has completed
		// capture them by pointer to allow everything to be captured by value
		// and simplify the capture expression
		bool done = false;
		Ret r;
		std::exception_ptr ex;
		dispatch(s->get_context(), [=, &r, &done, &ex]() mutable
		{
#ifndef BOOST_NO_EXCEPTIONS
			try {
#endif
				r = (s.get()->*f)(std::forward<Args>(a)...);
#ifndef BOOST_NO_EXCEPTIONS
			} catch (...) {
				ex = std::current_exception();
			}
#endif
			std::unique_lock<std::mutex> l(s->mut);
			done = true;
			s->cond.notify_all();
		});

		aux::torrent_wait(done, *s);
		if (ex) std::rethrow_exception(ex);
		return r;
	}